

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::Run(Benchmark *this)

{
  FILE *__stream;
  bool bVar1;
  undefined8 uVar2;
  Slice local_160 [2];
  Slice local_140;
  int local_12c;
  undefined1 local_128 [4];
  int n;
  Slice local_118;
  Slice local_108;
  Slice local_f8;
  Slice local_e8;
  Slice local_d8;
  Slice local_c8;
  Slice local_b8;
  Slice local_a8;
  Slice local_98;
  Slice local_88;
  Slice local_78;
  Slice local_68;
  byte local_52;
  byte local_51;
  undefined1 auStack_50 [6];
  bool write_sync;
  bool known;
  char *local_48;
  Slice local_40;
  undefined1 local_30 [8];
  Slice name;
  char *sep;
  char *benchmarks;
  Benchmark *this_local;
  
  PrintHeader(this);
  Open(this);
  sep = FLAGS_benchmarks;
  while (sep != (char *)0x0) {
    name.size_ = (size_t)strchr(sep,0x2c);
    Slice::Slice((Slice *)local_30);
    if (name.size_ == 0) {
      Slice::Slice(&local_40,sep);
      local_30 = (undefined1  [8])local_40.data_;
      name.data_ = (char *)local_40.size_;
      sep = (char *)0x0;
    }
    else {
      Slice::Slice((Slice *)auStack_50,sep,name.size_ - (long)sep);
      local_30 = (undefined1  [8])_auStack_50;
      name.data_ = local_48;
      sep = (char *)(name.size_ + 1);
    }
    this->bytes_ = 0;
    Start(this);
    local_51 = 1;
    local_52 = 0;
    Slice::Slice(&local_68,"fillseq");
    bVar1 = operator==((Slice *)local_30,&local_68);
    if (bVar1) {
      Write(this,(bool)(local_52 & 1),SEQUENTIAL,FRESH,this->num_,FLAGS_value_size,1);
      WalCheckpoint(this->db_);
    }
    else {
      Slice::Slice(&local_78,"fillseqbatch");
      bVar1 = operator==((Slice *)local_30,&local_78);
      if (bVar1) {
        Write(this,(bool)(local_52 & 1),SEQUENTIAL,FRESH,this->num_,FLAGS_value_size,1000);
        WalCheckpoint(this->db_);
      }
      else {
        Slice::Slice(&local_88,"fillrandom");
        bVar1 = operator==((Slice *)local_30,&local_88);
        if (bVar1) {
          Write(this,(bool)(local_52 & 1),RANDOM,FRESH,this->num_,FLAGS_value_size,1);
          WalCheckpoint(this->db_);
        }
        else {
          Slice::Slice(&local_98,"fillrandbatch");
          bVar1 = operator==((Slice *)local_30,&local_98);
          if (bVar1) {
            Write(this,(bool)(local_52 & 1),RANDOM,FRESH,this->num_,FLAGS_value_size,1000);
            WalCheckpoint(this->db_);
          }
          else {
            Slice::Slice(&local_a8,"overwrite");
            bVar1 = operator==((Slice *)local_30,&local_a8);
            if (bVar1) {
              Write(this,(bool)(local_52 & 1),RANDOM,EXISTING,this->num_,FLAGS_value_size,1);
              WalCheckpoint(this->db_);
            }
            else {
              Slice::Slice(&local_b8,"overwritebatch");
              bVar1 = operator==((Slice *)local_30,&local_b8);
              if (bVar1) {
                Write(this,(bool)(local_52 & 1),RANDOM,EXISTING,this->num_,FLAGS_value_size,1000);
                WalCheckpoint(this->db_);
              }
              else {
                Slice::Slice(&local_c8,"fillrandsync");
                bVar1 = operator==((Slice *)local_30,&local_c8);
                if (bVar1) {
                  local_52 = 1;
                  Write(this,true,RANDOM,FRESH,this->num_ / 100,FLAGS_value_size,1);
                  WalCheckpoint(this->db_);
                }
                else {
                  Slice::Slice(&local_d8,"fillseqsync");
                  bVar1 = operator==((Slice *)local_30,&local_d8);
                  if (bVar1) {
                    local_52 = 1;
                    Write(this,true,SEQUENTIAL,FRESH,this->num_ / 100,FLAGS_value_size,1);
                    WalCheckpoint(this->db_);
                  }
                  else {
                    Slice::Slice(&local_e8,"fillrand100K");
                    bVar1 = operator==((Slice *)local_30,&local_e8);
                    if (bVar1) {
                      Write(this,(bool)(local_52 & 1),RANDOM,FRESH,this->num_ / 1000,100000,1);
                      WalCheckpoint(this->db_);
                    }
                    else {
                      Slice::Slice(&local_f8,"fillseq100K");
                      bVar1 = operator==((Slice *)local_30,&local_f8);
                      if (bVar1) {
                        Write(this,(bool)(local_52 & 1),SEQUENTIAL,FRESH,this->num_ / 1000,100000,1)
                        ;
                        WalCheckpoint(this->db_);
                      }
                      else {
                        Slice::Slice(&local_108,"readseq");
                        bVar1 = operator==((Slice *)local_30,&local_108);
                        if (bVar1) {
                          ReadSequential(this);
                        }
                        else {
                          Slice::Slice(&local_118,"readrandom");
                          bVar1 = operator==((Slice *)local_30,&local_118);
                          if (bVar1) {
                            Read(this,RANDOM,1);
                          }
                          else {
                            Slice::Slice((Slice *)local_128,"readrand100K");
                            bVar1 = operator==((Slice *)local_30,(Slice *)local_128);
                            if (bVar1) {
                              local_12c = this->reads_;
                              this->reads_ = this->reads_ / 1000;
                              Read(this,RANDOM,1);
                              this->reads_ = local_12c;
                            }
                            else {
                              local_51 = 0;
                              Slice::Slice(&local_140);
                              bVar1 = operator!=((Slice *)local_30,&local_140);
                              __stream = _stderr;
                              if (bVar1) {
                                Slice::ToString_abi_cxx11_(local_160);
                                uVar2 = std::__cxx11::string::c_str();
                                fprintf(__stream,"unknown benchmark \'%s\'\n",uVar2);
                                std::__cxx11::string::~string((string *)local_160);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_51 & 1) != 0) {
      Stop(this,(Slice *)local_30);
    }
  }
  return;
}

Assistant:

void Run() {
    PrintHeader();
    Open();

    const char* benchmarks = FLAGS_benchmarks;
    while (benchmarks != nullptr) {
      const char* sep = strchr(benchmarks, ',');
      Slice name;
      if (sep == nullptr) {
        name = benchmarks;
        benchmarks = nullptr;
      } else {
        name = Slice(benchmarks, sep - benchmarks);
        benchmarks = sep + 1;
      }

      bytes_ = 0;
      Start();

      bool known = true;
      bool write_sync = false;
      if (name == Slice("fillseq")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqbatch")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandom")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandbatch")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("overwrite")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("overwritebatch")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandsync")) {
        write_sync = true;
        Write(write_sync, RANDOM, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqsync")) {
        write_sync = true;
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrand100K")) {
        Write(write_sync, RANDOM, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseq100K")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("readseq")) {
        ReadSequential();
      } else if (name == Slice("readrandom")) {
        Read(RANDOM, 1);
      } else if (name == Slice("readrand100K")) {
        int n = reads_;
        reads_ /= 1000;
        Read(RANDOM, 1);
        reads_ = n;
      } else {
        known = false;
        if (name != Slice()) {  // No error message for empty name
          std::fprintf(stderr, "unknown benchmark '%s'\n",
                       name.ToString().c_str());
        }
      }
      if (known) {
        Stop(name);
      }
    }
  }